

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

uchar * print(cJSON *item,cJSON_bool format,internal_hooks *hooks)

{
  long lVar1;
  cJSON_bool cVar2;
  long in_FS_OFFSET;
  uchar *local_98;
  cJSON *local_80;
  uchar *printed;
  internal_hooks *hooks_local;
  cJSON_bool format_local;
  cJSON *item_local;
  undefined1 local_58 [8];
  printbuffer buffer [1];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_58,0,0x40);
  local_58 = (undefined1  [8])(*hooks->allocate)(0x100);
  buffer[0].buffer = (uchar *)0x100;
  buffer[0]._32_8_ = hooks->allocate;
  buffer[0].hooks.allocate = (_func_void_ptr_size_t *)hooks->deallocate;
  buffer[0].hooks.deallocate = (_func_void_void_ptr *)hooks->reallocate;
  buffer[0].depth._4_4_ = format;
  if ((local_58 != (undefined1  [8])0x0) &&
     (cVar2 = print_value(item,(printbuffer *)local_58), cVar2 != 0)) {
    update_offset((printbuffer *)local_58);
    if (hooks->reallocate == (_func_void_ptr_void_ptr_size_t *)0x0) {
      local_80 = (cJSON *)(*hooks->allocate)(buffer[0].length + 1);
      if (local_80 != (cJSON *)0x0) {
        if (buffer[0].buffer < (uchar *)(buffer[0].length + 1)) {
          local_98 = buffer[0].buffer;
        }
        else {
          local_98 = (uchar *)(buffer[0].length + 1);
        }
        memcpy(local_80,(void *)local_58,(size_t)local_98);
        *(undefined1 *)((long)&local_80->next + buffer[0].length) = 0;
        (*hooks->deallocate)((void *)local_58);
        goto LAB_0010409c;
      }
    }
    else {
      local_80 = (cJSON *)(*hooks->reallocate)((void *)local_58,buffer[0].length + 1);
      if (local_80 != (cJSON *)0x0) {
        local_58 = (undefined1  [8])0x0;
LAB_0010409c:
        item_local = local_80;
        goto LAB_001040d8;
      }
    }
  }
  if (local_58 != (undefined1  [8])0x0) {
    (*hooks->deallocate)((void *)local_58);
  }
  item_local = (cJSON *)0x0;
LAB_001040d8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (uchar *)item_local;
  }
  __stack_chk_fail();
}

Assistant:

static unsigned char *print(const cJSON * const item, cJSON_bool format, const internal_hooks * const hooks)
{
    static const size_t default_buffer_size = 256;
    printbuffer buffer[1];
    unsigned char *printed = NULL;

    memset(buffer, 0, sizeof(buffer));

    /* create buffer */
    buffer->buffer = (unsigned char*) hooks->allocate(default_buffer_size);
    buffer->length = default_buffer_size;
    buffer->format = format;
    buffer->hooks = *hooks;
    if (buffer->buffer == NULL)
    {
        goto fail;
    }

    /* print the value */
    if (!print_value(item, buffer))
    {
        goto fail;
    }
    update_offset(buffer);

    /* check if reallocate is available */
    if (hooks->reallocate != NULL)
    {
        printed = (unsigned char*) hooks->reallocate(buffer->buffer, buffer->offset + 1);
        if (printed == NULL) {
            goto fail;
        }
        buffer->buffer = NULL;
    }
    else /* otherwise copy the JSON over to a new buffer */
    {
        printed = (unsigned char*) hooks->allocate(buffer->offset + 1);
        if (printed == NULL)
        {
            goto fail;
        }
        memcpy(printed, buffer->buffer, cjson_min(buffer->length, buffer->offset + 1));
        printed[buffer->offset] = '\0'; /* just to be sure */

        /* free the buffer */
        hooks->deallocate(buffer->buffer);
    }

    return printed;

fail:
    if (buffer->buffer != NULL)
    {
        hooks->deallocate(buffer->buffer);
    }

    if (printed != NULL)
    {
        hooks->deallocate(printed);
    }

    return NULL;
}